

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pyraminx.cpp
# Opt level: O0

void __thiscall Pyraminx::turn_layer(Pyraminx *this,Corner corner,int layer,Direction dir)

{
  element_type *peVar1;
  undefined1 local_118 [64];
  vector<Color,_std::allocator<Color>_> local_d8;
  undefined1 local_c0 [8];
  vector<Color,_std::allocator<Color>_> receiver_old_color;
  undefined1 local_90 [8];
  vector<Color,_std::allocator<Color>_> old_color;
  vector<Color,_std::allocator<Color>_> sender_color;
  shared_ptr<Face> receiving_face;
  undefined1 local_40 [8];
  shared_ptr<Face> sending_face;
  shared_ptr<Face> ref_face;
  Direction dir_local;
  int layer_local;
  Corner corner_local;
  Pyraminx *this_local;
  
  if (layer == 2) {
    ref_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._5_3_ = 0;
    ref_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_1_ =
         dir == clockwise;
    turn_layer(this,corner,0,
               ref_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
              );
    turn_layer(this,corner,1,
               ref_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
              );
    turn_layer(this,corner,3,
               ref_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
              );
  }
  else {
    std::shared_ptr<Face>::shared_ptr
              ((shared_ptr<Face> *)
               &sending_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if (corner == B) {
      std::shared_ptr<Face>::operator=
                ((shared_ptr<Face> *)
                 &sending_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 &this->green_face);
    }
    else {
      std::shared_ptr<Face>::operator=
                ((shared_ptr<Face> *)
                 &sending_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 &this->blue_face);
    }
    peVar1 = std::__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &sending_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
    Face::get_sending_neighbor((Face *)local_40,(Corner)peVar1,corner);
    peVar1 = std::__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &sending_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
    Face::get_receiving_neighbor
              ((Face *)&sender_color.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,(Corner)peVar1,corner);
    peVar1 = std::__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_40);
    Face::get_layer((vector<Color,_std::allocator<Color>_> *)
                    &old_color.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,peVar1,corner,layer);
    peVar1 = std::__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &sending_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
    std::vector<Color,_std::allocator<Color>_>::vector
              ((vector<Color,_std::allocator<Color>_> *)
               &receiver_old_color.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               (vector<Color,_std::allocator<Color>_> *)
               &old_color.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    Face::update_layer((vector<Color,_std::allocator<Color>_> *)local_90,peVar1,corner,layer,
                       (vector<Color,_std::allocator<Color>_> *)
                       &receiver_old_color.super__Vector_base<Color,_std::allocator<Color>_>._M_impl
                        .super__Vector_impl_data._M_end_of_storage);
    std::vector<Color,_std::allocator<Color>_>::~vector
              ((vector<Color,_std::allocator<Color>_> *)
               &receiver_old_color.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    peVar1 = std::__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &sender_color.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    std::vector<Color,_std::allocator<Color>_>::vector
              (&local_d8,(vector<Color,_std::allocator<Color>_> *)local_90);
    Face::update_layer((vector<Color,_std::allocator<Color>_> *)local_c0,peVar1,corner,layer,
                       &local_d8);
    std::vector<Color,_std::allocator<Color>_>::~vector(&local_d8);
    peVar1 = std::__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_40);
    std::vector<Color,_std::allocator<Color>_>::vector
              ((vector<Color,_std::allocator<Color>_> *)(local_118 + 0x10),
               (vector<Color,_std::allocator<Color>_> *)local_c0);
    Face::update_layer((vector<Color,_std::allocator<Color>_> *)(local_118 + 0x28),peVar1,corner,
                       layer,(vector<Color,_std::allocator<Color>_> *)(local_118 + 0x10));
    std::vector<Color,_std::allocator<Color>_>::~vector
              ((vector<Color,_std::allocator<Color>_> *)(local_118 + 0x28));
    std::vector<Color,_std::allocator<Color>_>::~vector
              ((vector<Color,_std::allocator<Color>_> *)(local_118 + 0x10));
    if (layer == 3) {
      ref_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._5_3_ = 0;
      ref_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_1_ =
           dir == clockwise;
      get_opposite_face((Pyraminx *)local_118,(Corner)this);
      peVar1 = std::__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          local_118);
      Face::turn_face(peVar1,ref_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi._4_4_);
      std::shared_ptr<Face>::~shared_ptr((shared_ptr<Face> *)local_118);
    }
    std::vector<Color,_std::allocator<Color>_>::~vector
              ((vector<Color,_std::allocator<Color>_> *)local_c0);
    std::vector<Color,_std::allocator<Color>_>::~vector
              ((vector<Color,_std::allocator<Color>_> *)local_90);
    std::vector<Color,_std::allocator<Color>_>::~vector
              ((vector<Color,_std::allocator<Color>_> *)
               &old_color.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::shared_ptr<Face>::~shared_ptr
              ((shared_ptr<Face> *)
               &sender_color.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::shared_ptr<Face>::~shared_ptr((shared_ptr<Face> *)local_40);
    std::shared_ptr<Face>::~shared_ptr
              ((shared_ptr<Face> *)
               &sending_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  return;
}

Assistant:

void Pyraminx::turn_layer(Corner corner, int layer, Direction dir){
    // To keep the middle piece fixed in our view,
    // treat middle layer twists as counter-twists of all other layers
    if(layer == 2){
        if(dir == Direction::clockwise){
            dir = Direction::counterclockwise;
        }
        else{
            dir = Direction::clockwise;
        }
        turn_layer(corner, 0, dir);
        turn_layer(corner, 1, dir);
        turn_layer(corner, 3, dir);
    }
    else{
        // If we are turning from the back corner, treat 
        // the green face as the reference face. 
        // Otherwise use the blue face as the reference.
        std::shared_ptr<Face> ref_face;
        if(corner == Corner::B){
            ref_face = green_face;
        }
        else{
            ref_face = blue_face;
        }
        std::shared_ptr<Face> sending_face = ref_face->get_sending_neighbor(corner, dir);
        std::shared_ptr<Face> receiving_face = ref_face->get_receiving_neighbor(corner, dir);
        std::vector<Color> sender_color = sending_face->get_layer(corner, layer);
        std::vector<Color> old_color = ref_face->update_layer(corner, layer, sender_color);
        std::vector<Color> receiver_old_color = receiving_face->update_layer(corner, layer, old_color);
        sending_face->update_layer(corner, layer, receiver_old_color);

        // If we rotate a base layer, we are also rotating the face 
        // opposite the corner in the reverse direction
        if(layer == 3){
            if(dir == Direction::clockwise){
                dir = Direction::counterclockwise;
            }
            else{
                dir = Direction::clockwise;
            }
            get_opposite_face(corner)->turn_face(dir);
        }
    }
}